

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileReturn(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  sxi32 iP1;
  
  pSVar2 = pGen->pIn;
  pSVar1 = pSVar2 + 1;
  pGen->pIn = pSVar1;
  iP1 = 0;
  if ((pSVar1 < pGen->pEnd) && (iP1 = 0, (pSVar2[1].nType & 0x40000) == 0)) {
    iP1 = 0;
    sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar3 == -10) {
      return -10;
    }
    if (sVar3 != -3) {
      iP1 = 1;
    }
  }
  jx9VmEmitInstr(pGen->pVm,1,iP1,0,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileReturn(jx9_gen_state *pGen)
{
	sxi32 nRet = 0; /* TRUE if there is a return value */
	sxi32 rc;
	/* Jump the 'return' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Compile the expression */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if(rc != SXERR_EMPTY ){
			nRet = 1;
		}
	}
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, nRet, 0, 0, 0);
	return SXRET_OK;
}